

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CtorExceptionTextTest.cpp
# Opt level: O1

void __thiscall CtorExceptionTextTest::CtorExceptionTextTest(CtorExceptionTextTest *this)

{
  undefined1 local_a9;
  shared_ptr<const_oout::NamedTest> local_a8;
  shared_ptr<oout::CtorExceptionText<WithException>_> local_98;
  shared_ptr<oout::CtorExceptionText<WithException>_> local_88;
  shared_ptr<oout::EqualMatch> local_78;
  shared_ptr<oout::EqualMatch> local_68;
  shared_ptr<const_oout::NamedTest> local_58;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Exception in ctor represent as a text","");
  local_88.super___shared_ptr<oout::CtorExceptionText<WithException>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_88.super___shared_ptr<oout::CtorExceptionText<WithException>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  (local_88.super___shared_ptr<oout::CtorExceptionText<WithException>,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_use_count = 1;
  (local_88.super___shared_ptr<oout::CtorExceptionText<WithException>,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_weak_count = 1;
  (local_88.super___shared_ptr<oout::CtorExceptionText<WithException>,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00197f10
  ;
  local_88.super___shared_ptr<oout::CtorExceptionText<WithException>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           (local_88.
            super___shared_ptr<oout::CtorExceptionText<WithException>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi + 1);
  local_88.super___shared_ptr<oout::CtorExceptionText<WithException>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR__CtorExceptionText_00197f60;
  local_88.super___shared_ptr<oout::CtorExceptionText<WithException>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._M_use_count = 0;
  local_88.super___shared_ptr<oout::CtorExceptionText<WithException>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._M_weak_count = 0;
  local_88.super___shared_ptr<oout::CtorExceptionText<WithException>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_88.super___shared_ptr<oout::CtorExceptionText<WithException>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[3]._vptr__Sp_counted_base =
       (_func_int **)
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DronMDF[P]2out/2out/../2out/CtorExceptionText.h:19:13)>
       ::_M_invoke;
  *(code **)&local_88.
             super___shared_ptr<oout::CtorExceptionText<WithException>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi[2]._M_use_count =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DronMDF[P]2out/2out/../2out/CtorExceptionText.h:19:13)>
       ::_M_manager;
  local_68.super___shared_ptr<oout::EqualMatch,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::EqualMatch,std::allocator<oout::EqualMatch>,char_const(&)[12]>
            (&local_68.super___shared_ptr<oout::EqualMatch,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (EqualMatch **)&local_68,(allocator<oout::EqualMatch> *)&local_a8,
             (char (*) [12])"shit happen");
  local_58.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::NamedTest_const,std::allocator<oout::NamedTest>,char_const(&)[41],std::shared_ptr<oout::CtorExceptionText<WithException>>,std::shared_ptr<oout::EqualMatch>>
            (&local_58.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(NamedTest **)&local_58,(allocator<oout::NamedTest> *)&local_a8,
             (char (*) [41])"CtorExceptionText is a exception message",&local_88,&local_68);
  local_98.super___shared_ptr<oout::CtorExceptionText<WithException>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_98.super___shared_ptr<oout::CtorExceptionText<WithException>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  (local_98.super___shared_ptr<oout::CtorExceptionText<WithException>,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_use_count = 1;
  (local_98.super___shared_ptr<oout::CtorExceptionText<WithException>,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_weak_count = 1;
  (local_98.super___shared_ptr<oout::CtorExceptionText<WithException>,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00197f10
  ;
  local_98.super___shared_ptr<oout::CtorExceptionText<WithException>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           (local_98.
            super___shared_ptr<oout::CtorExceptionText<WithException>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi + 1);
  local_98.super___shared_ptr<oout::CtorExceptionText<WithException>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR__CtorExceptionText_00197f60;
  local_98.super___shared_ptr<oout::CtorExceptionText<WithException>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._M_use_count = 0;
  local_98.super___shared_ptr<oout::CtorExceptionText<WithException>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._M_weak_count = 0;
  local_98.super___shared_ptr<oout::CtorExceptionText<WithException>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_98.super___shared_ptr<oout::CtorExceptionText<WithException>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[2]._M_use_count = 0;
  local_98.super___shared_ptr<oout::CtorExceptionText<WithException>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[2]._M_weak_count = 0;
  local_98.super___shared_ptr<oout::CtorExceptionText<WithException>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(char **)&local_98.
             super___shared_ptr<oout::CtorExceptionText<WithException>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi[1]._M_use_count = "argument";
  local_98.super___shared_ptr<oout::CtorExceptionText<WithException>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[3]._vptr__Sp_counted_base =
       (_func_int **)
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DronMDF[P]2out/2out/../2out/CtorExceptionText.h:19:13)>
       ::_M_invoke;
  *(code **)&local_98.
             super___shared_ptr<oout::CtorExceptionText<WithException>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi[2]._M_use_count =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DronMDF[P]2out/2out/../2out/CtorExceptionText.h:19:13)>
       ::_M_manager;
  local_78.super___shared_ptr<oout::EqualMatch,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::EqualMatch,std::allocator<oout::EqualMatch>,char_const(&)[9]>
            (&local_78.super___shared_ptr<oout::EqualMatch,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (EqualMatch **)&local_78,(allocator<oout::EqualMatch> *)&local_a9,
             (char (*) [9])"argument");
  local_a8.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::NamedTest_const,std::allocator<oout::NamedTest>,char_const(&)[40],std::shared_ptr<oout::CtorExceptionText<WithException>>,std::shared_ptr<oout::EqualMatch>>
            (&local_a8.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(NamedTest **)&local_a8,(allocator<oout::NamedTest> *)&local_a9,
             (char (*) [40])"CtorExceptionText pass args to CUT ctor",&local_98,&local_78);
  oout::dirty::Test::
  Test<std::shared_ptr<oout::NamedTest_const>,std::shared_ptr<oout::NamedTest_const>>
            (&this->super_Test,&local_48,&local_58,&local_a8);
  if (local_a8.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_78.super___shared_ptr<oout::EqualMatch,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<oout::EqualMatch,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (local_98.
      super___shared_ptr<oout::CtorExceptionText<WithException>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.
               super___shared_ptr<oout::CtorExceptionText<WithException>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_58.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_68.super___shared_ptr<oout::EqualMatch,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<oout::EqualMatch,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (local_88.
      super___shared_ptr<oout::CtorExceptionText<WithException>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.
               super___shared_ptr<oout::CtorExceptionText<WithException>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  (this->super_Test).super_Test._vptr_Test = (_func_int **)&PTR__Test_00197ed0;
  return;
}

Assistant:

CtorExceptionTextTest::CtorExceptionTextTest()
: dirty::Test(
	"Exception in ctor represent as a text",
	make_shared<const NamedTest>(
		"CtorExceptionText is a exception message",
		make_shared<CtorExceptionText<WithException>>(),
		make_shared<EqualMatch>("shit happen")
	),
	make_shared<const NamedTest>(
		"CtorExceptionText pass args to CUT ctor",
		make_shared<CtorExceptionText<WithException>>("argument"),
		make_shared<EqualMatch>("argument")
	)
)
{
}